

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadersConfig.h
# Opt level: O0

void __thiscall
jaegertracing::propagation::HeadersConfig::HeadersConfig
          (HeadersConfig *this,string *jaegerDebugHeader,string *jaegerBaggageHeader,
          string *traceContextHeaderName,string *traceBaggageHeaderPrefix)

{
  ulong uVar1;
  allocator local_49;
  byte local_48;
  allocator local_47;
  byte local_46;
  allocator local_45 [19];
  byte local_32;
  allocator local_31;
  string *local_30;
  string *traceBaggageHeaderPrefix_local;
  string *traceContextHeaderName_local;
  string *jaegerBaggageHeader_local;
  string *jaegerDebugHeader_local;
  HeadersConfig *this_local;
  
  local_30 = traceBaggageHeaderPrefix;
  traceBaggageHeaderPrefix_local = traceContextHeaderName;
  traceContextHeaderName_local = jaegerBaggageHeader;
  jaegerBaggageHeader_local = jaegerDebugHeader;
  jaegerDebugHeader_local = &this->_jaegerDebugHeader;
  uVar1 = std::__cxx11::string::empty();
  local_32 = 0;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)this,(string *)jaegerBaggageHeader_local);
  }
  else {
    std::allocator<char>::allocator();
    local_32 = 1;
    std::__cxx11::string::string((string *)this,"jaeger-debug-id",&local_31);
  }
  if ((local_32 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  uVar1 = std::__cxx11::string::empty();
  local_46 = 0;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string
              ((string *)&this->_jaegerBaggageHeader,(string *)traceContextHeaderName_local);
  }
  else {
    std::allocator<char>::allocator();
    local_46 = 1;
    std::__cxx11::string::string((string *)&this->_jaegerBaggageHeader,"jaeger-baggage",local_45);
  }
  if ((local_46 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_45);
  }
  uVar1 = std::__cxx11::string::empty();
  local_48 = 0;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string
              ((string *)&this->_traceContextHeaderName,(string *)traceBaggageHeaderPrefix_local);
  }
  else {
    std::allocator<char>::allocator();
    local_48 = 1;
    std::__cxx11::string::string((string *)&this->_traceContextHeaderName,"uber-trace-id",&local_47)
    ;
  }
  if ((local_48 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_47);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&this->_traceBaggageHeaderPrefix,(string *)local_30);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&this->_traceBaggageHeaderPrefix,"uberctx-",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return;
}

Assistant:

HeadersConfig(const std::string& jaegerDebugHeader,
                  const std::string& jaegerBaggageHeader,
                  const std::string& traceContextHeaderName,
                  const std::string& traceBaggageHeaderPrefix)
        : _jaegerDebugHeader(jaegerDebugHeader.empty() ? kJaegerDebugHeader
                                                       : jaegerDebugHeader)
        , _jaegerBaggageHeader(jaegerBaggageHeader.empty()
                                   ? kJaegerBaggageHeader
                                   : jaegerBaggageHeader)
        , _traceContextHeaderName(traceContextHeaderName.empty()
                                      ? kTraceContextHeaderName
                                      : traceContextHeaderName)
        , _traceBaggageHeaderPrefix(traceBaggageHeaderPrefix.empty()
                                        ? kTraceBaggageHeaderPrefix
                                        : traceBaggageHeaderPrefix)
    {
    }